

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O3

void R_DrawAddColumnP_C(void)

{
  lighttable_t *plVar1;
  fixed_t fVar2;
  DWORD *pDVar3;
  DWORD *pDVar4;
  BYTE *pBVar5;
  int iVar6;
  byte *pbVar7;
  uint uVar8;
  fixed_t fVar9;
  long lVar10;
  
  pBVar5 = dc_source;
  pDVar4 = dc_destblend;
  pDVar3 = dc_srcblend;
  fVar2 = dc_iscale;
  plVar1 = dc_colormap;
  if (0 < dc_count) {
    lVar10 = (long)dc_pitch;
    pbVar7 = dc_dest;
    iVar6 = dc_count;
    fVar9 = dc_texturefrac;
    do {
      uVar8 = pDVar4[*pbVar7] + pDVar3[plVar1[pBVar5[fVar9 >> 0x10]]] | 0x1f07c1f;
      *pbVar7 = RGB32k.All[uVar8 >> 0xf & uVar8];
      pbVar7 = pbVar7 + lVar10;
      fVar9 = fVar9 + fVar2;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  return;
}

Assistant:

void R_DrawAddColumnP_C (void)
{
	int count;
	BYTE *dest;
	fixed_t frac;
	fixed_t fracstep;

	count = dc_count;
	if (count <= 0)
		return;

	dest = dc_dest;

	fracstep = dc_iscale;
	frac = dc_texturefrac;

	{
		DWORD *fg2rgb = dc_srcblend;
		DWORD *bg2rgb = dc_destblend;
		BYTE *colormap = dc_colormap;
		const BYTE *source = dc_source;
		int pitch = dc_pitch;

		do
		{
			DWORD fg = colormap[source[frac>>FRACBITS]];
			DWORD bg = *dest;

			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			*dest = RGB32k.All[fg & (fg>>15)];
			dest += pitch;
			frac += fracstep;
		} while (--count);
	}
}